

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeKernelSetIndirectAccess
          (ze_kernel_handle_t hKernel,ze_kernel_indirect_access_flags_t flags)

{
  ze_result_t zVar1;
  
  if (DAT_0010e660 != (code *)0x0) {
    zVar1 = (*DAT_0010e660)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSetIndirectAccess(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        ze_kernel_indirect_access_flags_t flags         ///< [in] kernel indirect access flags
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetIndirectAccess = context.zeDdiTable.Kernel.pfnSetIndirectAccess;
        if( nullptr != pfnSetIndirectAccess )
        {
            result = pfnSetIndirectAccess( hKernel, flags );
        }
        else
        {
            // generic implementation
        }

        return result;
    }